

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::computeQuadTexCoords
               (vector<float,_std::allocator<float>_> *texCoord,TextureImageIterator *iteration)

{
  TextureImageIterator *pTVar1;
  deUint32 dVar2;
  int iVar3;
  CubeFace face;
  float fVar4;
  Vector<float,_2> local_64;
  Vector<float,_2> local_5c;
  Vector<int,_3> local_54;
  Vector<float,_3> local_48;
  Vector<float,_3> local_3c;
  float local_30;
  float r;
  Vector<float,_2> local_24;
  int local_1c;
  TextureImageIterator *pTStack_18;
  int currentImage;
  TextureImageIterator *iteration_local;
  vector<float,_std::allocator<float>_> *texCoord_local;
  
  pTStack_18 = iteration;
  iteration_local = (TextureImageIterator *)texCoord;
  local_1c = TextureImageIterator::getCurrentImage(iteration);
  dVar2 = TextureImageIterator::getTarget(pTStack_18);
  pTVar1 = iteration_local;
  iVar3 = local_1c;
  if (dVar2 == 0xde1) {
    tcu::Vector<float,_2>::Vector(&local_24,0.0,0.0);
    tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&stack0xffffffffffffffd4,1.0,1.0);
    glu::TextureTestUtil::computeQuadTexCoord2D
              ((vector<float,_std::allocator<float>_> *)pTVar1,&local_24,
               (Vec2 *)&stack0xffffffffffffffd4);
  }
  else if (dVar2 == 0x806f) {
    fVar4 = (float)local_1c;
    iVar3 = TextureImageIterator::getLevelImageCount(pTStack_18);
    pTVar1 = iteration_local;
    local_30 = (fVar4 + 0.5) / (float)iVar3;
    tcu::Vector<float,_3>::Vector(&local_3c,0.0,0.0,local_30);
    tcu::Vector<float,_3>::Vector(&local_48,1.0,1.0,local_30);
    tcu::Vector<int,_3>::Vector(&local_54,0,1,2);
    glu::TextureTestUtil::computeQuadTexCoord3D
              ((vector<float,_std::allocator<float>_> *)pTVar1,&local_3c,&local_48,&local_54);
  }
  else if (dVar2 == 0x8513) {
    dVar2 = mapFaceNdxToFace(local_1c);
    face = glu::getCubeFaceFromGL(dVar2);
    glu::TextureTestUtil::computeQuadTexCoordCube
              ((vector<float,_std::allocator<float>_> *)pTVar1,face);
  }
  else if (dVar2 == 0x8c1a) {
    tcu::Vector<float,_2>::Vector(&local_5c,0.0,0.0);
    tcu::Vector<float,_2>::Vector(&local_64,1.0,1.0);
    glu::TextureTestUtil::computeQuadTexCoord2DArray
              ((vector<float,_std::allocator<float>_> *)pTVar1,iVar3,&local_5c,&local_64);
  }
  return;
}

Assistant:

void computeQuadTexCoords(vector<float>& texCoord, const TextureImageIterator& iteration)
{
	const int currentImage = iteration.getCurrentImage();
	switch (iteration.getTarget())
	{
		case GL_TEXTURE_2D:
			computeQuadTexCoord2D(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));
			break;

		case GL_TEXTURE_3D:
		{
			const float r = (float(currentImage) + 0.5f) / (float)iteration.getLevelImageCount();
			computeQuadTexCoord3D(texCoord, tcu::Vec3(0.0f, 0.0f, r), tcu::Vec3(1.0f, 1.0f, r), tcu::IVec3(0, 1, 2));
			break;
		}

		case GL_TEXTURE_CUBE_MAP:
			computeQuadTexCoordCube(texCoord, glu::getCubeFaceFromGL(mapFaceNdxToFace(currentImage)));
			break;

		case GL_TEXTURE_2D_ARRAY:
			computeQuadTexCoord2DArray(texCoord, currentImage, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));
			break;

		default:
			DE_FATAL("Unsupported texture target");
	}
}